

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::EmptyMemberSyntax::setChild(EmptyMemberSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  TokenList *in_RDI;
  Token TVar2;
  TokenList *this_00;
  SyntaxNode *local_20;
  Info *local_18;
  
  this_00 = (TokenList *)&stack0x00000008;
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x1d2faa);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>(pSVar1);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDI,
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00);
  }
  else if (in_RSI == 1) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x1d2fce);
    SyntaxNode::as<slang::syntax::TokenList>(pSVar1);
    TokenList::operator=(in_RDI,this_00);
  }
  else {
    TVar2 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)this_00);
    local_20 = TVar2._0_8_;
    in_RDI[2].super_SyntaxListBase.super_SyntaxNode.previewNode = local_20;
    local_18 = TVar2.info;
    in_RDI[2].super_SyntaxListBase.childCount = (size_t)local_18;
  }
  return;
}

Assistant:

void EmptyMemberSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: qualifiers = child.node()->as<TokenList>(); return;
        case 2: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}